

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O2

type_conflict8 __thiscall chaiscript::parse_num<long>(chaiscript *this,string_view t_str)

{
  chaiscript *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  for (pcVar1 = (chaiscript *)0x0;
      (this != pcVar1 && ((byte)((char)pcVar1[t_str._M_len] - 0x30U) < 10)); pcVar1 = pcVar1 + 1) {
    lVar2 = (ulong)((byte)pcVar1[t_str._M_len] & 0xf) + lVar2 * 10;
  }
  return lVar2;
}

Assistant:

[[nodiscard]] constexpr auto parse_num(const std::string_view t_str) noexcept -> typename std::enable_if<std::is_integral<T>::value, T>::type {
    T t = 0;
    for (const auto c : t_str) {
      if (c < '0' || c > '9') {
        return t;
      }
      t *= 10;
      t += c - '0';
    }
    return t;
  }